

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall kj::String::operator=(String *this,String *param_1)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pcVar1 = (this->content).ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->content).size_;
    pAVar3 = (this->content).disposer;
    (this->content).ptr = (char *)0x0;
    (this->content).size_ = 0;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  (this->content).ptr = (param_1->content).ptr;
  (this->content).size_ = (param_1->content).size_;
  (this->content).disposer = (param_1->content).disposer;
  (param_1->content).ptr = (char *)0x0;
  (param_1->content).size_ = 0;
  return this;
}

Assistant:

String() = default;